

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_listen2cluster(void *ignore)

{
  uint uVar1;
  void *uuid_;
  undefined8 *protocol_;
  int *piVar2;
  fio_lock_i ret;
  
  fio_lock(&cluster_data.lock);
  uuid_ = (void *)fio_socket(cluster_data.name,(char *)0x0,'\x01');
  LOCK();
  cluster_data.lock = '\0';
  UNLOCK();
  cluster_data.uuid = (intptr_t)uuid_;
  if ((long)uuid_ < 0) {
    if (0 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("FATAL: (facil.io cluster) failed to open cluster socket.");
    }
    perror("             check file permissions. errno:");
  }
  else {
    protocol_ = (undefined8 *)malloc(0x30);
    if (protocol_ != (undefined8 *)0x0) {
      *protocol_ = fio_cluster_listen_accept;
      protocol_[1] = 0;
      protocol_[2] = mock_on_shutdown_eternal;
      protocol_[3] = fio_cluster_listen_on_close;
      protocol_[4] = mock_ping_eternal;
      protocol_[5] = 0;
      if (4 < FIO_LOG_LEVEL) {
        uVar1 = getpid();
        FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:6233): (%d) Listening to cluster: %s"
                       ,(ulong)uVar1,0x17f4f9);
        uuid_ = (void *)cluster_data.uuid;
      }
      fio_attach__internal(uuid_,protocol_);
      return;
    }
    if (0 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:6225"
                    );
    }
    kill(0,2);
  }
  piVar2 = __errno_location();
  exit(*piVar2);
}

Assistant:

static void fio_listen2cluster(void *ignore) {
  /* this is called for each `fork`, but we only need this to run once. */
  fio_lock(&cluster_data.lock);
  cluster_data.uuid = fio_socket(cluster_data.name, NULL, 1);
  fio_unlock(&cluster_data.lock);
  if (cluster_data.uuid < 0) {
    FIO_LOG_FATAL("(facil.io cluster) failed to open cluster socket.");
    perror("             check file permissions. errno:");
    exit(errno);
  }
  fio_protocol_s *p = malloc(sizeof(*p));
  FIO_ASSERT_ALLOC(p);
  *p = (fio_protocol_s){
      .on_data = fio_cluster_listen_accept,
      .on_shutdown = mock_on_shutdown_eternal,
      .ping = mock_ping_eternal,
      .on_close = fio_cluster_listen_on_close,
  };
  FIO_LOG_DEBUG("(%d) Listening to cluster: %s", (int)getpid(),
                cluster_data.name);
  fio_attach(cluster_data.uuid, p);
  (void)ignore;
}